

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O3

void __thiscall QPngHandler::setOption(QPngHandler *this,ImageOption option,QVariant *value)

{
  long lVar1;
  QPngHandlerPrivate *pQVar2;
  QArrayData *pQVar3;
  int iVar4;
  long in_FS_OFFSET;
  float fVar5;
  Data *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  switch(option) {
  case Description:
    ::QVariant::toString();
    pQVar2 = this->d;
    pQVar3 = &((pQVar2->description).d.d)->super_QArrayData;
    (pQVar2->description).d.d = local_38;
    (pQVar2->description).d.ptr = pcStack_30;
    (pQVar2->description).d.size = local_28;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    break;
  case CompressionRatio:
    iVar4 = ::QVariant::toInt((bool *)value);
    this->d->compression = iVar4;
    break;
  case Gamma:
    fVar5 = (float)::QVariant::toFloat((bool *)value);
    this->d->gamma = fVar5;
    break;
  case Quality:
    iVar4 = ::QVariant::toInt((bool *)value);
    this->d->quality = iVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPngHandler::setOption(ImageOption option, const QVariant &value)
{
    if (option == Gamma)
        d->gamma = value.toFloat();
    else if (option == Quality)
        d->quality = value.toInt();
    else if (option == CompressionRatio)
        d->compression = value.toInt();
    else if (option == Description)
        d->description = value.toString();
}